

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O2

bool deqp::gles2::Functional::compare<float>(deUint32 func,float a,float b)

{
  bool bVar1;
  
  switch(func) {
  case 0x201:
    bVar1 = b < a;
    break;
  case 0x202:
    bVar1 = a == b;
    goto LAB_00edae8a;
  case 0x203:
    bVar1 = b < a;
    goto LAB_00edae95;
  case 0x204:
    bVar1 = a < b;
    break;
  case 0x205:
    bVar1 = a != b;
LAB_00edae8a:
    return (bool)(-bVar1 & 1);
  case 0x206:
    bVar1 = a < b;
LAB_00edae95:
    return !bVar1;
  case 0x207:
    return true;
  default:
    return false;
  }
  return !bVar1 && a != b;
}

Assistant:

static inline bool compare (deUint32 func, T a, T b)
{
	switch (func)
	{
		case GL_NEVER:		return false;
		case GL_ALWAYS:		return true;
		case GL_LESS:		return a < b;
		case GL_LEQUAL:		return a <= b;
		case GL_EQUAL:		return a == b;
		case GL_NOTEQUAL:	return a != b;
		case GL_GEQUAL:		return a >= b;
		case GL_GREATER:	return a > b;
		default:
			DE_ASSERT(DE_FALSE);
			return false;
	}
}